

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int analyzeAggregate(Walker *pWalker,Expr *pExpr)

{
  byte bVar1;
  u8 enc;
  short sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  DbFixer *pDVar6;
  Parse *pPVar7;
  Parse *pPVar8;
  AggInfo *pAVar9;
  ExprList *pEVar10;
  Expr *pEVar11;
  bool bVar12;
  int iVar13;
  AggInfo_col *pAVar14;
  AggInfo_col *pAVar15;
  AggInfo_func *pAVar16;
  FuncDef *pFVar17;
  uint uVar18;
  char **ppcVar19;
  i16 *piVar20;
  ExprList_item *pEVar21;
  int *in_R8;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  int i_1;
  int i;
  int local_44;
  int *local_40;
  int local_34;
  
  pDVar6 = (pWalker->u).pFix;
  pPVar7 = pDVar6->pParse;
  pPVar8 = (pDVar6->w).pParse;
  pAVar9 = (AggInfo *)(pDVar6->w).xExprCallback;
  bVar1 = pExpr->op;
  if (bVar1 < 0xa9) {
    if (bVar1 != 0xa7) {
      if (bVar1 != 0xa8) {
        return 0;
      }
      if (((pDVar6->w).walkerDepth & 0x20000) != 0) {
        return 0;
      }
      if (pWalker->walkerDepth != (uint)pExpr->op2) {
        return 0;
      }
      if (pAVar9->nFunc < 1) {
        uVar24 = 0;
      }
      else {
        pAVar16 = pAVar9->aFunc;
        uVar24 = 0;
        do {
          if ((pAVar16->pFExpr == pExpr) ||
             (iVar13 = sqlite3ExprCompare((Parse *)0x0,pAVar16->pFExpr,pExpr,-1), iVar13 == 0))
          break;
          uVar23 = (int)uVar24 + 1;
          uVar24 = (ulong)uVar23;
          pAVar16 = pAVar16 + 1;
        } while ((int)uVar23 < pAVar9->nFunc);
      }
      if (pAVar9->nFunc <= (int)uVar24) {
        enc = pPVar7->db->enc;
        pAVar16 = (AggInfo_func *)
                  sqlite3ArrayAllocate(pPVar7->db,pAVar9->aFunc,(int)pAVar9 + 0x38,&local_34,in_R8);
        pAVar9->aFunc = pAVar16;
        uVar24 = (ulong)local_34;
        if (-1 < (long)uVar24) {
          pAVar16[uVar24].pFExpr = pExpr;
          iVar13 = pPVar7->nMem + 1;
          pPVar7->nMem = iVar13;
          pAVar16[uVar24].iMem = iVar13;
          if ((pExpr->x).pList == (ExprList *)0x0) {
            iVar13 = 0;
          }
          else {
            iVar13 = ((pExpr->x).pList)->nExpr;
          }
          pFVar17 = sqlite3FindFunction(pPVar7->db,(pExpr->u).zToken,iVar13,enc,'\0');
          pAVar16[uVar24].pFunc = pFVar17;
          iVar13 = -1;
          if ((pExpr->flags & 4) != 0) {
            iVar13 = pPVar7->nTab;
            pPVar7->nTab = iVar13 + 1;
          }
          pAVar16[uVar24].iDistinct = iVar13;
        }
      }
      pExpr->iAgg = (i16)uVar24;
      pExpr->pAggInfo = pAVar9;
      return 1;
    }
  }
  else if ((bVar1 != 0xb3) && (bVar1 != 0xa9)) {
    return 0;
  }
  if (pPVar8 == (Parse *)0x0) {
    return 1;
  }
  if (*(int *)&pPVar8->db < 1) {
    return 1;
  }
  ppcVar19 = &pPVar8->zErrMsg;
  local_40 = &pAVar9->nColumn;
  iVar13 = 0;
  do {
    iVar3 = pExpr->iTable;
    iVar4 = *(int *)(ppcVar19 + 8);
    if (iVar3 == iVar4) {
      uVar23 = pAVar9->nColumn;
      bVar12 = 0 < (int)uVar23;
      if (0 < (int)uVar23) {
        piVar20 = &pAVar9->aCol->iColumn;
        uVar24 = 0;
        do {
          if (((*(int *)(piVar20 + -4) == iVar3) &&
              (in_R8 = (int *)(ulong)(ushort)*piVar20, *piVar20 == pExpr->iColumn)) &&
             (pExpr->op != 0xb3)) {
            if (bVar12) goto LAB_001ab7a7;
            break;
          }
          uVar18 = (int)uVar24 + 1;
          uVar24 = (ulong)uVar18;
          bVar12 = (int)uVar18 < (int)uVar23;
          piVar20 = piVar20 + 0x10;
        } while (uVar23 != uVar18);
      }
      pAVar14 = (AggInfo_col *)
                sqlite3ArrayAllocate(pPVar7->db,pAVar9->aCol,(int)local_40,&local_44,in_R8);
      pAVar9->aCol = pAVar14;
      uVar24 = (ulong)local_44;
      if (-1 < (long)uVar24) {
        in_R8 = (int *)(uVar24 * 0x20);
        pAVar15 = pAVar14 + uVar24;
        *(anon_union_8_3_c79b3df9_for_y *)(pAVar14 + uVar24) = pExpr->y;
        iVar5 = pExpr->iTable;
        pAVar14[uVar24].iTable = iVar5;
        sVar2 = pExpr->iColumn;
        pAVar14[uVar24].iColumn = sVar2;
        iVar22 = pPVar7->nMem + 1;
        pPVar7->nMem = iVar22;
        pAVar14[uVar24].iMem = iVar22;
        pAVar14[uVar24].iSorterColumn = -1;
        pAVar14[uVar24].pCExpr = pExpr;
        pEVar10 = pAVar9->pGroupBy;
        if ((pEVar10 != (ExprList *)0x0) && (pExpr->op != 0xb3)) {
          uVar23 = pEVar10->nExpr;
          in_R8 = (int *)(ulong)uVar23;
          if (0 < (int)uVar23) {
            pEVar21 = pEVar10->a;
            uVar18 = 0;
            do {
              pEVar11 = pEVar21->pExpr;
              if (((pEVar11->op == 0xa7) && (pEVar11->iTable == iVar5)) &&
                 (pEVar11->iColumn == sVar2)) {
                pAVar15->iSorterColumn = (i16)uVar18;
                break;
              }
              uVar18 = uVar18 + 1;
              pEVar21 = pEVar21 + 1;
            } while (uVar23 != uVar18);
          }
        }
        if (pAVar15->iSorterColumn < 0) {
          iVar5 = pAVar9->nSortingColumn;
          pAVar9->nSortingColumn = iVar5 + 1;
          pAVar15->iSorterColumn = (i16)iVar5;
        }
      }
LAB_001ab7a7:
      pExpr->pAggInfo = pAVar9;
      if (pExpr->op == 0xa7) {
        pExpr->op = 0xa9;
      }
      pExpr->iAgg = (i16)uVar24;
      if (iVar3 == iVar4) {
        return 1;
      }
    }
    iVar13 = iVar13 + 1;
    ppcVar19 = ppcVar19 + 0xd;
    if (*(int *)&pPVar8->db <= iVar13) {
      return 1;
    }
  } while( true );
}

Assistant:

static int analyzeAggregate(Walker *pWalker, Expr *pExpr){
  int i;
  NameContext *pNC = pWalker->u.pNC;
  Parse *pParse = pNC->pParse;
  SrcList *pSrcList = pNC->pSrcList;
  AggInfo *pAggInfo = pNC->uNC.pAggInfo;

  assert( pNC->ncFlags & NC_UAggInfo );
  switch( pExpr->op ){
    case TK_IF_NULL_ROW:
    case TK_AGG_COLUMN:
    case TK_COLUMN: {
      testcase( pExpr->op==TK_AGG_COLUMN );
      testcase( pExpr->op==TK_COLUMN );
      testcase( pExpr->op==TK_IF_NULL_ROW );
      /* Check to see if the column is in one of the tables in the FROM
      ** clause of the aggregate query */
      if( ALWAYS(pSrcList!=0) ){
        SrcItem *pItem = pSrcList->a;
        for(i=0; i<pSrcList->nSrc; i++, pItem++){
          struct AggInfo_col *pCol;
          assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
          if( pExpr->iTable==pItem->iCursor ){
            /* If we reach this point, it means that pExpr refers to a table
            ** that is in the FROM clause of the aggregate query.
            **
            ** Make an entry for the column in pAggInfo->aCol[] if there
            ** is not an entry there already.
            */
            int k;
            pCol = pAggInfo->aCol;
            for(k=0; k<pAggInfo->nColumn; k++, pCol++){
              if( pCol->iTable==pExpr->iTable
               && pCol->iColumn==pExpr->iColumn
               && pExpr->op!=TK_IF_NULL_ROW
              ){
                break;
              }
            }
            if( (k>=pAggInfo->nColumn)
             && (k = addAggInfoColumn(pParse->db, pAggInfo))>=0
            ){
              pCol = &pAggInfo->aCol[k];
              assert( ExprUseYTab(pExpr) );
              pCol->pTab = pExpr->y.pTab;
              pCol->iTable = pExpr->iTable;
              pCol->iColumn = pExpr->iColumn;
              pCol->iMem = ++pParse->nMem;
              pCol->iSorterColumn = -1;
              pCol->pCExpr = pExpr;
              if( pAggInfo->pGroupBy && pExpr->op!=TK_IF_NULL_ROW ){
                int j, n;
                ExprList *pGB = pAggInfo->pGroupBy;
                struct ExprList_item *pTerm = pGB->a;
                n = pGB->nExpr;
                for(j=0; j<n; j++, pTerm++){
                  Expr *pE = pTerm->pExpr;
                  if( pE->op==TK_COLUMN
                   && pE->iTable==pExpr->iTable
                   && pE->iColumn==pExpr->iColumn
                  ){
                    pCol->iSorterColumn = j;
                    break;
                  }
                }
              }
              if( pCol->iSorterColumn<0 ){
                pCol->iSorterColumn = pAggInfo->nSortingColumn++;
              }
            }
            /* There is now an entry for pExpr in pAggInfo->aCol[] (either
            ** because it was there before or because we just created it).
            ** Convert the pExpr to be a TK_AGG_COLUMN referring to that
            ** pAggInfo->aCol[] entry.
            */
            ExprSetVVAProperty(pExpr, EP_NoReduce);
            pExpr->pAggInfo = pAggInfo;
            if( pExpr->op==TK_COLUMN ){
              pExpr->op = TK_AGG_COLUMN;
            }
            pExpr->iAgg = (i16)k;
            break;
          } /* endif pExpr->iTable==pItem->iCursor */
        } /* end loop over pSrcList */
      }
      return WRC_Prune;
    }
    case TK_AGG_FUNCTION: {
      if( (pNC->ncFlags & NC_InAggFunc)==0
       && pWalker->walkerDepth==pExpr->op2
      ){
        /* Check to see if pExpr is a duplicate of another aggregate
        ** function that is already in the pAggInfo structure
        */
        struct AggInfo_func *pItem = pAggInfo->aFunc;
        for(i=0; i<pAggInfo->nFunc; i++, pItem++){
          if( pItem->pFExpr==pExpr ) break;
          if( sqlite3ExprCompare(0, pItem->pFExpr, pExpr, -1)==0 ){
            break;
          }
        }
        if( i>=pAggInfo->nFunc ){
          /* pExpr is original.  Make a new entry in pAggInfo->aFunc[]
          */
          u8 enc = ENC(pParse->db);
          i = addAggInfoFunc(pParse->db, pAggInfo);
          if( i>=0 ){
            assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
            pItem = &pAggInfo->aFunc[i];
            pItem->pFExpr = pExpr;
            pItem->iMem = ++pParse->nMem;
            assert( ExprUseUToken(pExpr) );
            pItem->pFunc = sqlite3FindFunction(pParse->db,
                   pExpr->u.zToken,
                   pExpr->x.pList ? pExpr->x.pList->nExpr : 0, enc, 0);
            if( pExpr->flags & EP_Distinct ){
              pItem->iDistinct = pParse->nTab++;
            }else{
              pItem->iDistinct = -1;
            }
          }
        }
        /* Make pExpr point to the appropriate pAggInfo->aFunc[] entry
        */
        assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
        ExprSetVVAProperty(pExpr, EP_NoReduce);
        pExpr->iAgg = (i16)i;
        pExpr->pAggInfo = pAggInfo;
        return WRC_Prune;
      }else{
        return WRC_Continue;
      }
    }
  }
  return WRC_Continue;
}